

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_cache.cc
# Opt level: O2

void __thiscall tcmalloc::ThreadCache::Scavenge(ThreadCache *this)

{
  uint uVar1;
  uint32_t uVar2;
  uint uVar3;
  uint32_t uVar4;
  ulong uVar5;
  ThreadCache *src;
  
  src = this;
  uVar3 = DAT_00158b10;
  for (uVar5 = 0; uVar5 < uVar3; uVar5 = uVar5 + 1) {
    uVar1 = src->list_[0].lowater_;
    if (0 < (int)uVar1) {
      uVar3 = uVar1 >> 1;
      if (uVar1 == 1) {
        uVar3 = 1;
      }
      ReleaseToCentralCache(this,src->list_,(uint32_t)uVar5,uVar3);
      uVar3 = DAT_00158b10;
      uVar2 = *(uint32_t *)(&DAT_00158304 + uVar5 * 4);
      uVar1 = src->list_[0].max_length_;
      if ((ulong)(long)(int)uVar2 < (ulong)uVar1) {
        uVar4 = uVar1 - uVar2;
        if ((int)uVar4 <= (int)uVar2) {
          uVar4 = uVar2;
        }
        src->list_[0].max_length_ = uVar4;
      }
    }
    src->list_[0].lowater_ = src->list_[0].length_;
    src = (ThreadCache *)(src->list_ + 1);
  }
  IncreaseCacheLimit(this);
  return;
}

Assistant:

void ThreadCache::Scavenge() {
  // If the low-water mark for the free list is L, it means we would
  // not have had to allocate anything from the central cache even if
  // we had reduced the free list size by L.  We aim to get closer to
  // that situation by dropping L/2 nodes from the free list.  This
  // may not release much memory, but if so we will call scavenge again
  // pretty soon and the low-water marks will be high on that call.
  for (int cl = 0; cl < Static::num_size_classes(); cl++) {
    FreeList* list = &list_[cl];
    const int lowmark = list->lowwatermark();
    if (lowmark > 0) {
      const int drop = (lowmark > 1) ? lowmark/2 : 1;
      ReleaseToCentralCache(list, cl, drop);

      // Shrink the max length if it isn't used.  Only shrink down to
      // batch_size -- if the thread was active enough to get the max_length
      // above batch_size, it will likely be that active again.  If
      // max_length shinks below batch_size, the thread will have to
      // go through the slow-start behavior again.  The slow-start is useful
      // mainly for threads that stay relatively idle for their entire
      // lifetime.
      const int batch_size = Static::sizemap()->num_objects_to_move(cl);
      if (list->max_length() > batch_size) {
        list->set_max_length(
          std::max<int>(list->max_length() - batch_size, batch_size));
      }
    }
    list->clear_lowwatermark();
  }

  IncreaseCacheLimit();
}